

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier
          (CurrencySpacingEnabledModifier *this,NumberStringBuilder *prefix,
          NumberStringBuilder *suffix,bool overwrite,bool strong,DecimalFormatSymbols *symbols,
          UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeString *this_02;
  UBool UVar1;
  int32_t iVar2;
  UChar32 UVar3;
  UnicodeString *that;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  UnicodeString *pUVar5;
  UnicodeSet prefixUnicodeSet;
  UnicodeSet local_e0;
  UnicodeSet local_88;
  
  ConstantMultiFieldModifier::ConstantMultiFieldModifier
            (&this->super_ConstantMultiFieldModifier,prefix,suffix,overwrite,strong);
  (this->super_ConstantMultiFieldModifier).super_Modifier._vptr_Modifier =
       (_func_int **)&PTR__CurrencySpacingEnabledModifier_0047b250;
  this_00 = &this->fAfterPrefixUnicodeSet;
  UnicodeSet::UnicodeSet(this_00);
  pUVar5 = &this->fAfterPrefixInsert;
  (this->fAfterPrefixInsert).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->fAfterPrefixInsert).fUnion.fStackFields.fLengthAndFlags = 2;
  this_01 = &this->fBeforeSuffixUnicodeSet;
  UnicodeSet::UnicodeSet(this_01);
  this_02 = &this->fBeforeSuffixInsert;
  (this->fBeforeSuffixInsert).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->fBeforeSuffixInsert).fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = NumberStringBuilder::length(prefix);
  if (0 < iVar2) {
    iVar2 = NumberStringBuilder::length(prefix);
    if (prefix->fUsingHeap == false) {
      pVVar4 = &prefix->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(prefix->fFields).heap.ptr;
    }
    if (*(int *)((long)pVVar4 + ((long)prefix->fZero + (long)iVar2) * 4 + -4) == 7) {
      UVar3 = NumberStringBuilder::getLastCodePoint(prefix);
      getUnicodeSet(&local_88,symbols,IN_CURRENCY,PREFIX,status);
      UVar1 = UnicodeSet::contains(&local_88,UVar3);
      if (UVar1 == '\0') {
        UnicodeSet::setToBogus(this_00);
        icu_63::UnicodeString::setToBogus(pUVar5);
      }
      else {
        getUnicodeSet(&local_e0,symbols,IN_NUMBER,PREFIX,status);
        UnicodeSet::operator=(this_00,&local_e0);
        UnicodeSet::~UnicodeSet(&local_e0);
        UnicodeSet::freeze(this_00);
        that = DecimalFormatSymbols::getPatternForCurrencySpacing
                         (symbols,UNUM_CURRENCY_INSERT,'\0',status);
        icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_e0,that);
        icu_63::UnicodeString::moveFrom(pUVar5,(UnicodeString *)&local_e0);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_e0);
      }
      UnicodeSet::~UnicodeSet(&local_88);
      goto LAB_002a8f9c;
    }
  }
  UnicodeSet::setToBogus(this_00);
  icu_63::UnicodeString::setToBogus(pUVar5);
LAB_002a8f9c:
  iVar2 = NumberStringBuilder::length(suffix);
  if (0 < iVar2) {
    if (suffix->fUsingHeap == false) {
      pVVar4 = &suffix->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(suffix->fFields).heap.ptr;
    }
    if (pVVar4->value[suffix->fZero] == UNUM_CURRENCY_FIELD) {
      UVar3 = NumberStringBuilder::getLastCodePoint(suffix);
      getUnicodeSet(&local_88,symbols,IN_CURRENCY,SUFFIX,status);
      UVar1 = UnicodeSet::contains(&local_88,UVar3);
      if (UVar1 == '\0') {
        UnicodeSet::setToBogus(this_01);
        icu_63::UnicodeString::setToBogus(this_02);
      }
      else {
        getUnicodeSet(&local_e0,symbols,IN_NUMBER,SUFFIX,status);
        UnicodeSet::operator=(this_01,&local_e0);
        UnicodeSet::~UnicodeSet(&local_e0);
        UnicodeSet::freeze(this_01);
        pUVar5 = DecimalFormatSymbols::getPatternForCurrencySpacing
                           (symbols,UNUM_CURRENCY_INSERT,'\x01',status);
        icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_e0,pUVar5);
        icu_63::UnicodeString::moveFrom(this_02,(UnicodeString *)&local_e0);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_e0);
      }
      UnicodeSet::~UnicodeSet(&local_88);
      return;
    }
  }
  UnicodeSet::setToBogus(this_01);
  icu_63::UnicodeString::setToBogus(this_02);
  return;
}

Assistant:

CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier(const NumberStringBuilder &prefix,
                                                               const NumberStringBuilder &suffix,
                                                               bool overwrite,
                                                               bool strong,
                                                               const DecimalFormatSymbols &symbols,
                                                               UErrorCode &status)
        : ConstantMultiFieldModifier(prefix, suffix, overwrite, strong) {
    // Check for currency spacing. Do not build the UnicodeSets unless there is
    // a currency code point at a boundary.
    if (prefix.length() > 0 && prefix.fieldAt(prefix.length() - 1) == UNUM_CURRENCY_FIELD) {
        int prefixCp = prefix.getLastCodePoint();
        UnicodeSet prefixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, PREFIX, status);
        if (prefixUnicodeSet.contains(prefixCp)) {
            fAfterPrefixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, PREFIX, status);
            fAfterPrefixUnicodeSet.freeze();
            fAfterPrefixInsert = getInsertString(symbols, PREFIX, status);
        } else {
            fAfterPrefixUnicodeSet.setToBogus();
            fAfterPrefixInsert.setToBogus();
        }
    } else {
        fAfterPrefixUnicodeSet.setToBogus();
        fAfterPrefixInsert.setToBogus();
    }
    if (suffix.length() > 0 && suffix.fieldAt(0) == UNUM_CURRENCY_FIELD) {
        int suffixCp = suffix.getLastCodePoint();
        UnicodeSet suffixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, SUFFIX, status);
        if (suffixUnicodeSet.contains(suffixCp)) {
            fBeforeSuffixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, SUFFIX, status);
            fBeforeSuffixUnicodeSet.freeze();
            fBeforeSuffixInsert = getInsertString(symbols, SUFFIX, status);
        } else {
            fBeforeSuffixUnicodeSet.setToBogus();
            fBeforeSuffixInsert.setToBogus();
        }
    } else {
        fBeforeSuffixUnicodeSet.setToBogus();
        fBeforeSuffixInsert.setToBogus();
    }
}